

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O0

void __thiscall wabt::interp::Thread::PopValues(Thread *this,ValueTypes *types,Values *out_values)

{
  Values *this_00;
  size_type sVar1;
  size_type sVar2;
  iterator __last;
  iterator __result;
  __normal_iterator<wabt::interp::Value_*,_std::vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>_>
  local_30;
  __normal_iterator<wabt::interp::Value_*,_std::vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>_>
  local_28;
  Values *local_20;
  Values *out_values_local;
  ValueTypes *types_local;
  Thread *this_local;
  
  local_20 = out_values;
  out_values_local = (Values *)types;
  types_local = (ValueTypes *)this;
  sVar1 = std::vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>::size
                    (&this->values_);
  sVar2 = std::vector<wabt::Type,_std::allocator<wabt::Type>_>::size
                    ((vector<wabt::Type,_std::allocator<wabt::Type>_> *)out_values_local);
  this_00 = local_20;
  if (sVar2 <= sVar1) {
    sVar1 = std::vector<wabt::Type,_std::allocator<wabt::Type>_>::size
                      ((vector<wabt::Type,_std::allocator<wabt::Type>_> *)out_values_local);
    std::vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>::resize(this_00,sVar1);
    local_30._M_current =
         (Value *)std::vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>::end
                            (&this->values_);
    sVar1 = std::vector<wabt::Type,_std::allocator<wabt::Type>_>::size
                      ((vector<wabt::Type,_std::allocator<wabt::Type>_> *)out_values_local);
    local_28 = __gnu_cxx::
               __normal_iterator<wabt::interp::Value_*,_std::vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>_>
               ::operator-(&local_30,sVar1);
    __last = std::vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>::end
                       (&this->values_);
    __result = std::vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>::begin
                         (local_20);
    std::
    copy<__gnu_cxx::__normal_iterator<wabt::interp::Value*,std::vector<wabt::interp::Value,std::allocator<wabt::interp::Value>>>,__gnu_cxx::__normal_iterator<wabt::interp::Value*,std::vector<wabt::interp::Value,std::allocator<wabt::interp::Value>>>>
              (local_28,(__normal_iterator<wabt::interp::Value_*,_std::vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>_>
                         )__last._M_current,
               (__normal_iterator<wabt::interp::Value_*,_std::vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>_>
                )__result._M_current);
    sVar1 = std::vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>::size
                      (&this->values_);
    sVar2 = std::vector<wabt::Type,_std::allocator<wabt::Type>_>::size
                      ((vector<wabt::Type,_std::allocator<wabt::Type>_> *)out_values_local);
    std::vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>::resize
              (&this->values_,sVar1 - sVar2);
    return;
  }
  __assert_fail("values_.size() >= types.size()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/interp/interp.cc"
                ,0x3d6,"void wabt::interp::Thread::PopValues(const ValueTypes &, Values *)");
}

Assistant:

void Thread::PopValues(const ValueTypes& types, Values* out_values) {
  assert(values_.size() >= types.size());
  out_values->resize(types.size());
  std::copy(values_.end() - types.size(), values_.end(), out_values->begin());
  values_.resize(values_.size() - types.size());
}